

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall pugi::xml_attribute::as_bool(xml_attribute *this,bool def)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  
  if ((this->_attr != (xml_attribute_struct *)0x0) &&
     (pbVar2 = (byte *)this->_attr->value, pbVar2 != (byte *)0x0)) {
    bVar1 = *pbVar2;
    def = true;
    uVar3 = bVar1 - 0x54;
    if (((0x25 < uVar3) || ((0x2100000021U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) && (bVar1 != 0x31))
    {
      return false;
    }
  }
  return def;
}

Assistant:

PUGI_IMPL_FN bool xml_attribute::as_bool(bool def) const
	{
		if (!_attr) return def;
		const char_t* value = _attr->value;
		return value ? impl::get_value_bool(value) : def;
	}